

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O2

void __thiscall
HighsHessian::product
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *product)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  value_type_conflict1 local_30;
  
  if (0 < (long)this->dim_) {
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(product,(long)this->dim_,&local_30)
    ;
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar8 = (ulong)(uint)this->dim_;
    if (this->dim_ < 1) {
      uVar8 = uVar9;
    }
    while (uVar10 = uVar9, uVar10 != uVar8) {
      iVar1 = piVar3[uVar10 + 1];
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (product->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)piVar3[uVar10]; uVar9 = uVar10 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
        iVar2 = piVar4[lVar11];
        pdVar7[iVar2] = pdVar5[lVar11] * pdVar6[uVar10] + pdVar7[iVar2];
      }
    }
  }
  return;
}

Assistant:

void HighsHessian::product(const std::vector<double>& solution,
                           std::vector<double>& product) const {
  if (this->dim_ <= 0) return;
  product.assign(this->dim_, 0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
         iEl++) {
      const HighsInt iRow = this->index_[iEl];
      product[iRow] += this->value_[iEl] * solution[iCol];
    }
  }
}